

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

void __thiscall duckdb::TopNGlobalSinkState::~TopNGlobalSinkState(TopNGlobalSinkState *this)

{
  ~TopNGlobalSinkState(this);
  operator_delete(this);
  return;
}

Assistant:

TopNGlobalSinkState(ClientContext &context, const PhysicalTopN &op)
	    : heap(context, op.types, op.orders, op.limit, op.offset), boundary_value(op) {
	}